

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collectives.hpp
# Opt level: O1

void diy::mpi::Collectives<char,_void_*>::gather
               (communicator *comm,vector<char,_std::allocator<char>_> *in,
               vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               *out,int root)

{
  pointer pcVar1;
  pointer pcVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int iVar6;
  pointer pvVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  vector<int,_std::allocator<int>_> counts;
  vector<int,_std::allocator<int>_> offsets;
  vector<char,_std::allocator<char>_> buffer;
  
  counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (comm->rank_ == root) {
    std::vector<int,_std::allocator<int>_>::resize(&counts,(long)comm->size_);
  }
  pcVar1 = (in->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pcVar2 = (in->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  iVar6 = 0;
  if (pcVar1 != pcVar2) {
    iVar6 = (int)pcVar2 - (int)pcVar1;
  }
  offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,iVar6);
  Collectives<int,_void_*>::gather(comm,(int *)&offsets,&counts,root);
  offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (comm->rank_ == root) {
    std::vector<int,_std::allocator<int>_>::resize
              (&offsets,(long)counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2);
    *offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = 0;
    piVar5 = counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish + -1;
    if (counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != piVar5) {
      iVar6 = *counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [1] = iVar6;
      piVar4 = counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + 1;
      if (piVar4 != piVar5) {
        piVar3 = offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + 2;
        do {
          iVar6 = iVar6 + *piVar4;
          *piVar3 = iVar6;
          piVar4 = piVar4 + 1;
          piVar3 = piVar3 + 1;
        } while (piVar4 != piVar5);
      }
    }
  }
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (comm->rank_ == root) {
    std::vector<char,_std::allocator<char>_>::resize
              (&buffer,(long)counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish[-1] +
                       (long)offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish[-1]);
  }
  pcVar1 = (in->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pcVar2 = (in->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  iVar6 = 0;
  if (pcVar1 != pcVar2) {
    iVar6 = (int)pcVar2 - (int)pcVar1;
  }
  MPI_Gatherv(pcVar1,iVar6,&ompi_mpi_byte,
              buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
              ._M_start,
              counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start,offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,&ompi_mpi_byte,root,(comm->comm_).data);
  if (comm->rank_ == root) {
    std::
    vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ::resize(out,(long)comm->size_);
    pvVar7 = (out->
             super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((out->
        super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish != pvVar7) {
      lVar10 = 0;
      uVar8 = 0;
      lVar9 = 0;
      do {
        iVar6 = counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start[uVar8];
        std::vector<char,std::allocator<char>>::_M_range_insert<char*>
                  ((vector<char,std::allocator<char>> *)
                   ((long)&(pvVar7->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar10),
                   *(undefined8 *)
                    ((long)&(pvVar7->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                            super__Vector_impl_data._M_finish + lVar10),
                   buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar9,
                   buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar9 + iVar6);
        lVar9 = lVar9 + iVar6;
        uVar8 = uVar8 + 1;
        pvVar7 = (out->
                 super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar10 = lVar10 + 0x18;
      } while (uVar8 < (ulong)(((long)(out->
                                      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7 >>
                               3) * -0x5555555555555555));
    }
  }
  if (buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void gather(const communicator& comm, const std::vector<T>& in, std::vector< std::vector<T> >& out, int root)
    {
      std::vector<int> counts;
      if (comm.rank() == root)
      {
        counts.resize(static_cast<size_t>(comm.size()));
      }

      Collectives<int,void*>::gather(comm, count(in), counts, root);

      std::vector<int> offsets;
      if (comm.rank() == root)
      {
        offsets.resize(counts.size());
        offsets[0] = 0;
        std::partial_sum(counts.begin(), counts.end() - 1, offsets.begin() + 1);
      }

      int elem_size = count(in[0]);     // size of 1 vector element in units of mpi datatype
      std::vector<T> buffer;
      if (comm.rank() == root)
      {
        buffer.resize((offsets.back() + counts.back()) / elem_size);
      }

      detail::gather_v(comm, address(in), count(in), datatype_of(in),
                       address(buffer), counts.data(), offsets.data(),
                       root);

      if (comm.rank() == root)
      {
          out.resize(static_cast<size_t>(comm.size()));
          size_t offset = 0;
          for (size_t i = 0; i < out.size(); ++i)
          {
            auto count = static_cast<size_t>(counts[i] / elem_size);
            out[i].insert(out[i].end(), buffer.data() + offset, buffer.data() + offset + count);
            offset += count;
          }
      }
    }